

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O0

void __thiscall osc::ReceivedMessageArgumentIterator::Advance(ReceivedMessageArgumentIterator *this)

{
  uint32 uVar1;
  char *pcVar2;
  uint32 blobSize;
  ReceivedMessageArgumentIterator *this_local;
  
  if ((this->value_).typeTagPtr_ != (char *)0x0) {
    pcVar2 = (this->value_).typeTagPtr_;
    (this->value_).typeTagPtr_ = pcVar2 + 1;
    switch(*pcVar2) {
    case '\0':
      (this->value_).typeTagPtr_ = (this->value_).typeTagPtr_ + -1;
      break;
    default:
      (this->value_).typeTagPtr_ = (this->value_).typeTagPtr_ + -1;
      break;
    case 'F':
    case 'I':
    case 'N':
    case 'T':
      break;
    case 'S':
    case 's':
      pcVar2 = FindStr4End((this->value_).argumentPtr_);
      (this->value_).argumentPtr_ = pcVar2;
      break;
    case '[':
    case ']':
      break;
    case 'b':
      uVar1 = ToUInt32((this->value_).argumentPtr_);
      pcVar2 = (this->value_).argumentPtr_;
      uVar1 = RoundUp4(uVar1);
      (this->value_).argumentPtr_ = pcVar2 + (ulong)uVar1 + 4;
      break;
    case 'c':
    case 'f':
    case 'i':
    case 'm':
    case 'r':
      (this->value_).argumentPtr_ = (this->value_).argumentPtr_ + 4;
      break;
    case 'd':
    case 'h':
    case 't':
      (this->value_).argumentPtr_ = (this->value_).argumentPtr_ + 8;
    }
  }
  return;
}

Assistant:

void ReceivedMessageArgumentIterator::Advance()
{
    if( !value_.typeTagPtr_ )
        return;
        
    switch( *value_.typeTagPtr_++ ){
        case '\0':
            // don't advance past end
            --value_.typeTagPtr_;
            break;
            
        case TRUE_TYPE_TAG:
        case FALSE_TYPE_TAG:
        case NIL_TYPE_TAG:
        case INFINITUM_TYPE_TAG:
        
            // zero length
            break;

        case INT32_TYPE_TAG:
        case FLOAT_TYPE_TAG: 					
        case CHAR_TYPE_TAG:
        case RGBA_COLOR_TYPE_TAG:
        case MIDI_MESSAGE_TYPE_TAG:

            value_.argumentPtr_ += 4;
            break;

        case INT64_TYPE_TAG:
        case TIME_TAG_TYPE_TAG:
        case DOUBLE_TYPE_TAG:
				
            value_.argumentPtr_ += 8;
            break;

        case STRING_TYPE_TAG: 
        case SYMBOL_TYPE_TAG:

            // we use the unsafe function FindStr4End(char*) here because all of
            // the arguments have already been validated in
            // ReceivedMessage::Init() below.
            
            value_.argumentPtr_ = FindStr4End( value_.argumentPtr_ );
            break;

        case BLOB_TYPE_TAG:
            {
                // treat blob size as an unsigned int for the purposes of this calculation
                uint32 blobSize = ToUInt32( value_.argumentPtr_ );
                value_.argumentPtr_ = value_.argumentPtr_ + osc::OSC_SIZEOF_INT32 + RoundUp4( blobSize );
            }
            break;

        case ARRAY_BEGIN_TYPE_TAG:
        case ARRAY_END_TYPE_TAG: 

            //    [ Indicates the beginning of an array. The tags following are for
            //        data in the Array until a close brace tag is reached.
            //    ] Indicates the end of an array.

            // zero length, don't advance argument ptr
            break;

        default:    // unknown type tag
            // don't advance
            --value_.typeTagPtr_;
            break;
    }
}